

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::RandomWalkIntegrator::LiRandomWalk
          (RandomWalkIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,int depth)

{
  ulong uVar1;
  pointer pLVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ushort uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ulong uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  float afVar13 [4];
  ulong uVar14;
  ImageInfiniteLight *this_00;
  pointer pLVar15;
  DebugMLTSampler *this_01;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  float fVar17;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar35 [56];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar33 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar34 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined4 uVar43;
  undefined4 uVar45;
  undefined1 auVar44 [56];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar42 [64];
  Vector3f w;
  Vector3f woRender;
  Vector3f wiRender;
  SampledSpectrum SVar46;
  undefined1 auVar47 [16];
  SampledSpectrum beta;
  optional<pbrt::ShapeIntersection> si;
  BSDF bsdf;
  undefined1 local_2d8 [8];
  undefined8 uStack_2d0;
  Tuple3<pbrt::Vector3,_float> local_2c0;
  float local_2b0;
  float local_2ac;
  float local_2a8;
  undefined4 uStack_2a4;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  ScratchBuffer *local_290;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [4];
  float afStack_264 [5];
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_250;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_248;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_240;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_238;
  undefined8 local_138;
  RayDifferential local_130;
  BSDF local_d0;
  RayDifferential local_98;
  undefined1 auVar32 [64];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined8 uVar50;
  undefined8 uVar51;
  undefined1 auVar41 [64];
  
  local_278._8_8_ = local_278._0_8_;
  local_288._8_8_ = local_288._0_8_;
  *(long *)(in_FS_OFFSET + -0x2b0) = *(long *)(in_FS_OFFSET + -0x2b0) + 1;
  local_290 = scratchBuffer;
  if (((this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate.
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       .bits & 0xffffffffffff) == 0) {
    local_238._192_8_ = 0;
    local_238._200_8_ = 0;
    local_238._208_8_ = 0;
    local_238._216_8_ = 0;
    local_238._224_8_ = 0;
    local_238._232_8_ = 0;
    local_238._240_8_ = 0;
    local_238._248_8_ = 0;
    local_238._128_8_ = 0;
    local_238._136_8_ = 0;
    local_238._144_8_ = 0;
    local_238._152_8_ = 0;
    local_238._160_8_ = 0;
    local_238._168_8_ = 0;
    local_238._176_8_ = 0;
    local_238._184_8_ = 0;
    local_238._64_8_ = 0;
    local_238._72_8_ = 0;
    local_238._80_8_ = 0;
    local_238._88_8_ = 0;
    local_238._96_8_ = 0;
    local_238._104_8_ = 0;
    local_238._112_8_ = 0;
    local_238._120_8_ = 0;
    local_238.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_238._8_8_ = 0;
    local_238._16_8_ = 0;
    local_238._24_8_ = 0;
    local_238._32_8_ = 0;
    local_238._40_8_ = 0;
    local_238._48_8_ = 0;
    local_238._56_8_ = 0;
    local_138 = 0;
  }
  else {
    PrimitiveHandle::Intersect
              ((optional<pbrt::ShapeIntersection> *)&local_238.__align,
               &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate,
               &ray->super_Ray,INFINITY);
  }
  if ((char)local_138 == '\0') {
    pLVar15 = (this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.infiniteLights.
              super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
              super__Vector_impl_data._M_start;
    pLVar2 = *(pointer *)
              ((long)&(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                      infiniteLights.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data + 8);
    if (pLVar15 == pLVar2) {
      _local_2d8 = ZEXT816(0);
    }
    else {
      _local_2d8 = ZEXT816(0);
      do {
        uVar1 = (pLVar15->
                super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                ).bits;
        auVar18 = ZEXT816(0) << 0x40;
        auVar16 = ZEXT816(0) << 0x40;
        if (0x6ffffffffffff < uVar1) {
          this_00 = (ImageInfiniteLight *)(uVar1 & 0xffffffffffff);
          if (uVar1 >> 0x30 == 8) {
            auVar35 = ZEXT856(0);
            auVar44 = ZEXT856(0);
            SVar46 = ImageInfiniteLight::Le(this_00,&ray->super_Ray,lambda);
            auVar39._0_8_ = SVar46.values.values._8_8_;
            auVar39._8_56_ = auVar44;
            auVar16 = auVar39._0_16_;
            auVar23._0_8_ = SVar46.values.values._0_8_;
            auVar23._8_56_ = auVar35;
            auVar18 = auVar23._0_16_;
          }
          else if ((short)(uVar1 >> 0x30) == 7) {
            auVar35 = ZEXT856(0);
            auVar44 = ZEXT856(0);
            SVar46 = UniformInfiniteLight::Le
                               ((UniformInfiniteLight *)this_00,&ray->super_Ray,lambda);
            auVar38._0_8_ = SVar46.values.values._8_8_;
            auVar38._8_56_ = auVar44;
            auVar16 = auVar38._0_16_;
            auVar22._0_8_ = SVar46.values.values._0_8_;
            auVar22._8_56_ = auVar35;
            auVar18 = auVar22._0_16_;
          }
          else {
            auVar35 = ZEXT856(0);
            auVar44 = ZEXT856(0);
            SVar46 = PortalImageInfiniteLight::Le
                               ((PortalImageInfiniteLight *)this_00,&ray->super_Ray,lambda);
            auVar40._0_8_ = SVar46.values.values._8_8_;
            auVar40._8_56_ = auVar44;
            auVar16 = auVar40._0_16_;
            auVar24._0_8_ = SVar46.values.values._0_8_;
            auVar24._8_56_ = auVar35;
            auVar18 = auVar24._0_16_;
          }
        }
        auVar18 = vmovlhps_avx(auVar18,auVar16);
        local_2d8._4_4_ = auVar18._4_4_ + (float)local_2d8._4_4_;
        local_2d8._0_4_ = auVar18._0_4_ + (float)local_2d8._0_4_;
        uStack_2d0._0_4_ = auVar18._8_4_ + (float)uStack_2d0;
        uStack_2d0._4_4_ = auVar18._12_4_ + uStack_2d0._4_4_;
        pLVar15 = pLVar15 + 1;
      } while (pLVar15 != pLVar2);
    }
    auVar18 = vpermilpd_avx(_local_2d8,1);
  }
  else {
    w.super_Tuple3<pbrt::Vector3,_float>.z =
         -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
    uVar1._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
    uVar1._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar18._0_8_ = uVar1 ^ 0x8000000080000000;
    auVar18._8_4_ = 0x80000000;
    auVar18._12_4_ = 0x80000000;
    w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar18._0_8_;
    w.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar18._0_8_ >> 0x20);
    uVar43 = 0x80000000;
    uVar45 = 0x80000000;
    uStack_2d0 = auVar18._8_8_;
    SVar46 = SurfaceInteraction::Le((SurfaceInteraction *)&local_238.__align,w,lambda);
    local_2d8 = SVar46.values.values._0_8_;
    local_288._0_8_ = SVar46.values.values._8_8_;
    local_278._4_4_ = uVar45;
    local_278._0_4_ = uVar43;
    if (this->maxDepth == depth) {
      return (SampledSpectrum)(undefined1  [16])SVar46.values.values;
    }
    local_240.bits =
         (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
         .bits;
    local_248.bits =
         (sampler->
         super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
         ).bits;
    SurfaceInteraction::GetBSDF
              (&local_d0,(SurfaceInteraction *)&local_238.__align,ray,lambda,
               (CameraHandle *)&local_240,local_290,(SamplerHandle *)&local_248);
    auVar18 = local_288;
    if (((ulong)local_d0.bxdf.
                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                .bits & 0xffffffffffff) == 0) {
      auVar16._0_4_ = SUB84(local_2d8,0);
      auVar49._4_4_ = (int)((ulong)local_2d8 >> 0x20);
      register0x00001240 = local_288._0_4_;
      register0x00001244 = local_288._4_4_;
      return (SampledSpectrum)auVar16;
    }
    uVar1 = (sampler->
            super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
            ).bits;
    this_01 = (DebugMLTSampler *)(uVar1 & 0xffffffffffff);
    uVar6 = (ushort)(uVar1 >> 0x30);
    local_288 = auVar18;
    if (uVar1 >> 0x30 < 5) {
      if (uVar6 < 3) {
        if (uVar6 == 2) {
          auVar21._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)this_01);
          auVar21._8_56_ = extraout_var_00;
          auVar18 = auVar21._0_16_;
        }
        else {
          auVar28._0_8_ = RandomSampler::Get2D((RandomSampler *)this_01);
          auVar28._8_56_ = extraout_var_04;
          auVar18 = auVar28._0_16_;
        }
      }
      else if (uVar6 == 3) {
        auVar26._0_8_ = HaltonSampler::Get2D((HaltonSampler *)this_01);
        auVar26._8_56_ = extraout_var_02;
        auVar18 = auVar26._0_16_;
      }
      else {
        auVar30._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_01);
        auVar30._8_56_ = extraout_var_06;
        auVar18 = auVar30._0_16_;
      }
    }
    else if (uVar6 < 7) {
      if (uVar6 == 6) {
        auVar25._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)this_01);
        auVar25._8_56_ = extraout_var_01;
        auVar18 = auVar25._0_16_;
      }
      else {
        auVar29._0_8_ = SobolSampler::Get2D((SobolSampler *)this_01);
        auVar29._8_56_ = extraout_var_05;
        auVar18 = auVar29._0_16_;
      }
    }
    else if (uVar1 >> 0x30 == 8) {
      auVar31._0_8_ = MLTSampler::Get2D((MLTSampler *)this_01);
      auVar31._8_56_ = extraout_var_07;
      auVar18 = auVar31._0_16_;
    }
    else if (uVar6 == 7) {
      auVar27._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)this_01);
      auVar27._8_56_ = extraout_var_03;
      auVar18 = auVar27._0_16_;
    }
    else {
      local_2a8 = DebugMLTSampler::Get1D(this_01);
      uStack_2a4 = extraout_XMM0_Db;
      uStack_2a0 = extraout_XMM0_Dc;
      uStack_29c = extraout_XMM0_Dd;
      auVar34._0_4_ = DebugMLTSampler::Get1D(this_01);
      auVar34._4_60_ = extraout_var;
      auVar3._4_4_ = uStack_2a4;
      auVar3._0_4_ = local_2a8;
      auVar3._8_4_ = uStack_2a0;
      auVar3._12_4_ = uStack_29c;
      auVar18 = vinsertps_avx(auVar3,auVar34._0_16_,0x10);
    }
    auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar18,SUB6416(ZEXT464(0x3f800000),0))
    ;
    local_2ac = auVar16._0_4_;
    auVar16 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar16,auVar16);
    auVar16 = vmaxss_avx(auVar16,ZEXT816(0) << 0x40);
    if (auVar16._0_4_ < 0.0) {
      local_278 = auVar18;
      local_2a8 = sqrtf(auVar16._0_4_);
      auVar18 = local_278;
    }
    else {
      auVar16 = vsqrtss_avx(auVar16,auVar16);
      local_2a8 = auVar16._0_4_;
    }
    auVar18 = vmovshdup_avx(auVar18);
    local_2b0 = auVar18._0_4_ * 6.2831855;
    fVar17 = cosf(local_2b0);
    local_278 = ZEXT416((uint)(fVar17 * local_2a8));
    fVar17 = sinf(local_2b0);
    auVar18 = vinsertps_avx(local_278,ZEXT416((uint)(fVar17 * local_2a8)),0x10);
    local_2c0._0_8_ = vmovlps_avx(auVar18);
    local_2c0.z = local_2ac;
    uVar14._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
    uVar14._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar19._0_8_ = uVar14 ^ 0x8000000080000000;
    auVar19._8_4_ = 0x80000000;
    auVar19._12_4_ = 0x80000000;
    auVar36._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar36._4_4_ = 0x80000000;
    auVar36._8_4_ = 0x80000000;
    auVar36._12_4_ = 0x80000000;
    woRender.super_Tuple3<pbrt::Vector3,_float>.z = auVar36._0_4_;
    woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar19._0_8_;
    woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar19._0_8_ >> 0x20);
    auVar44 = ZEXT856(auVar36._8_8_);
    auVar35 = ZEXT856(auVar19._8_8_);
    wiRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar18._0_8_;
    wiRender.super_Tuple3<pbrt::Vector3,_float>.z = local_2ac;
    SVar46 = BSDF::f(&local_d0,woRender,wiRender,Radiance);
    auVar19 = local_288;
    auVar41._0_8_ = SVar46.values.values._8_8_;
    auVar41._8_56_ = auVar44;
    auVar32._0_8_ = SVar46.values.values._0_8_;
    auVar32._8_56_ = auVar35;
    auVar18 = vmovlhps_avx(auVar32._0_16_,auVar41._0_16_);
    auVar16 = vfmadd132ss_fma(ZEXT416((uint)local_238._132_4_),
                              ZEXT416((uint)((float)local_238._136_4_ * local_2c0.z)),
                              ZEXT416((uint)local_2c0.y));
    auVar3 = vfmsub213ss_fma(ZEXT416((uint)local_2c0.z),ZEXT416((uint)local_238._136_4_),
                             ZEXT416((uint)((float)local_238._136_4_ * local_2c0.z)));
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(auVar16._0_4_ + auVar3._0_4_)),
                              ZEXT416((uint)local_238._128_4_),ZEXT416((uint)local_2c0.x));
    auVar37._0_4_ = auVar16._0_4_;
    auVar37._4_4_ = auVar37._0_4_;
    auVar37._8_4_ = auVar37._0_4_;
    auVar37._12_4_ = auVar37._0_4_;
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar16 = vandps_avx512vl(auVar37,auVar4);
    auVar20._0_4_ = auVar16._0_4_ * auVar18._0_4_;
    auVar20._4_4_ = auVar16._4_4_ * auVar18._4_4_;
    auVar20._8_4_ = auVar16._8_4_ * auVar18._8_4_;
    auVar20._12_4_ = auVar16._12_4_ * auVar18._12_4_;
    auVar5._8_4_ = 0x3da2f983;
    auVar5._0_8_ = 0x3da2f9833da2f983;
    auVar5._12_4_ = 0x3da2f983;
    _local_268 = vdivps_avx512vl(auVar20,auVar5);
    if (((float)local_268 == 0.0) && (!NAN((float)local_268))) {
      uVar1 = 0;
      while (uVar14 = uVar1, uVar14 != 3) {
        if ((*(float *)(local_268 + uVar14 * 4 + 4) != 0.0) ||
           (uVar1 = uVar14 + 1, NAN(*(float *)(local_268 + uVar14 * 4 + 4)))) break;
      }
      if (2 < uVar14) {
        auVar47._0_4_ = SUB84(local_2d8,0);
        auVar48._4_4_ = (int)((ulong)local_2d8 >> 0x20);
        register0x00001240 = local_288._0_4_;
        register0x00001244 = local_288._4_4_;
        return (SampledSpectrum)auVar47;
      }
    }
    local_288 = auVar19;
    Interaction::SpawnRay(&local_130,(Interaction *)&local_238.__align,(Vector3f *)&local_2c0);
    (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x =
         local_130.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x;
    (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
         local_130.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y;
    *(undefined8 *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
         local_130.super_Ray._20_8_;
    (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x =
         local_130.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
    (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y =
         local_130.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
    *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
         CONCAT44(local_130.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x,
                  local_130.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z);
    (ray->super_Ray).medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (uintptr_t)
            local_130.super_Ray.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
    (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
         local_130.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y;
    (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
         local_130.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z;
    (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x =
         local_130.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x;
    (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
         local_130.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y;
    *(undefined8 *)&(ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z = local_130._76_8_;
    (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y =
         local_130.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y;
    (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z =
         local_130.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z;
    ray->hasDifferentials = local_130.hasDifferentials;
    *(undefined3 *)&ray->field_0x29 = local_130._41_3_;
    (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x =
         local_130.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x;
    (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
         local_130.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y;
    (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z =
         local_130.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z;
    (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x =
         local_130.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x;
    (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
         local_130.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y;
    *(ulong *)&(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
         CONCAT44(local_130.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x,
                  local_130.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z);
    local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x =
         (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
    local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y =
         (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
    uVar11 = *(undefined8 *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
    uVar12 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
    local_98.super_Ray._20_8_ =
         *(undefined8 *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
    local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar11;
    local_98.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)((ulong)uVar11 >> 0x20);
    local_98.super_Ray.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = local_130.super_Ray.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
    local_98.hasDifferentials = ray->hasDifferentials;
    local_98._41_3_ = *(undefined3 *)&ray->field_0x29;
    local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x =
         (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x;
    local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y =
         (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y;
    local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z =
         (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z;
    uVar7 = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x;
    uVar8 = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y;
    uVar9 = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z;
    uVar10._0_4_ = (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar10._4_4_ = (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
    local_98._76_8_ = *(undefined8 *)&(ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z;
    local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y =
         (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y;
    local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z =
         (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z;
    local_250.bits =
         (sampler->
         super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
         ).bits;
    auVar35 = ZEXT856((ulong)local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>._4_8_);
    auVar44 = ZEXT856(uVar10);
    local_98.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar12;
    local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar7;
    local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar8;
    local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar9;
    local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)uVar10;
    local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar10._4_4_;
    SVar46 = LiRandomWalk(this,&local_98,lambda,(SamplerHandle *)&local_250,local_290,depth + 1);
    auVar42._0_8_ = SVar46.values.values._8_8_;
    auVar42._8_56_ = auVar44;
    auVar33._0_8_ = SVar46.values.values._0_8_;
    auVar33._8_56_ = auVar35;
    auVar16 = vunpcklpd_avx(_local_2d8,local_288);
    auVar18 = vmovlhps_avx(auVar33._0_16_,auVar42._0_16_);
    local_2d8._0_4_ = auVar18._0_4_ * (float)local_268 + auVar16._0_4_;
    local_2d8._4_4_ = auVar18._4_4_ * afStack_264[0] + auVar16._4_4_;
    uStack_2d0._0_4_ = auVar18._8_4_ * afStack_264[1] + auVar16._8_4_;
    uStack_2d0._4_4_ = auVar18._12_4_ * afStack_264[2] + auVar16._12_4_;
    auVar18 = vshufpd_avx(_local_2d8,_local_2d8,1);
  }
  afVar13[2] = (float)(int)auVar18._0_8_;
  afVar13[3] = (float)(int)((ulong)auVar18._0_8_ >> 0x20);
  afVar13[0] = (float)local_2d8._0_4_;
  afVar13[1] = (float)local_2d8._4_4_;
  return (array<float,_4>)(array<float,_4>)afVar13;
}

Assistant:

SampledSpectrum LiRandomWalk(RayDifferential ray, SampledWavelengths &lambda,
                                 SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                 int depth) const {
        SampledSpectrum L(0.f);
        // Intersect ray with scene and return if no intersection
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        if (!si) {
            // Return emitted light from infinite light sources
            for (LightHandle light : infiniteLights)
                L += light.Le(ray, lambda);
            return L;
        }
        SurfaceInteraction &isect = si->intr;

        // Get emitted radiance at surface intersection
        L = isect.Le(-ray.d, lambda);

        // Terminate random walk if maximum depth has been reached
        if (depth == maxDepth)
            return L;

        // Compute BSDF at random walk intersection point
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf)
            return L;

        // Randomly sample direction leaving surface for random walk
        Point2f u = sampler.Get2D();
        Vector3f wi = SampleUniformSphere(u);

        // Evaluate BSDF at surface for sampled direction
        Vector3f wo = -ray.d;
        SampledSpectrum beta =
            bsdf.f(wo, wi) * AbsDot(wi, isect.shading.n) / (1 / (4 * Pi));
        if (!beta)
            return L;

        // Recursively trace ray to estimate incident radiance at surface
        ray = isect.SpawnRay(wi);
        return L + beta * LiRandomWalk(ray, lambda, sampler, scratchBuffer, depth + 1);
    }